

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hal_h264e_stream_amend.c
# Opt level: O0

MPP_RET h264e_vepu_stream_amend_sync_ref_idc(HalH264eVepuStreamAmend *ctx)

{
  uint uVar1;
  int fd_00;
  uint uVar2;
  void *pvVar3;
  MppBuffer buffer;
  RK_U32 nal_len;
  RK_S32 fd;
  MppBuffer buf;
  RK_S32 sw_nal_ref_idc;
  RK_S32 hw_nal_ref_idc;
  RK_U8 val;
  RK_U8 *p;
  RK_S32 len;
  RK_S32 base;
  MppPacket pkt;
  H264eSlice *slice;
  HalH264eVepuStreamAmend *ctx_local;
  
  pkt = ctx->slice;
  _len = ctx->packet;
  p._4_4_ = ctx->buf_base;
  p._0_4_ = ctx->old_length;
  slice = (H264eSlice *)ctx;
  pvVar3 = mpp_packet_get_pos(_len);
  _hw_nal_ref_idc = (RK_U8 *)((long)pvVar3 + (long)(int)p._4_4_);
  buffer = mpp_packet_get_buffer(_len);
  fd_00 = mpp_buffer_get_fd_with_caller(buffer,"h264e_vepu_stream_amend_sync_ref_idc");
  mpp_dmabuf_sync_partial_begin(fd_00,1,p._4_4_,(RK_U32)p,"h264e_vepu_stream_amend_sync_ref_idc");
  uVar1 = *(uint *)((long)pkt + 0x20);
  if (((int)(uint)_hw_nal_ref_idc[4] >> 5 & 3U) != uVar1) {
    if (*(int *)((long)pkt + 0x88) == 0) {
      _hw_nal_ref_idc[4] = _hw_nal_ref_idc[4] & 0x9f | (byte)((uVar1 & 3) << 5);
    }
    else {
      while( true ) {
        uVar2 = get_next_nal(_hw_nal_ref_idc,(RK_S32 *)&p);
        _hw_nal_ref_idc[4] = _hw_nal_ref_idc[4] & 0x9f | (byte)((uVar1 & 3) << 5);
        if ((RK_U32)p == 0) break;
        _hw_nal_ref_idc = _hw_nal_ref_idc + uVar2;
      }
    }
  }
  return MPP_OK;
}

Assistant:

MPP_RET h264e_vepu_stream_amend_sync_ref_idc(HalH264eVepuStreamAmend *ctx)
{
    H264eSlice *slice = ctx->slice;
    MppPacket pkt = ctx->packet;
    RK_S32 base = ctx->buf_base;
    RK_S32 len = ctx->old_length;
    RK_U8 *p = mpp_packet_get_pos(pkt) + base;
    RK_U8 val = 0;
    RK_S32 hw_nal_ref_idc = 0;
    RK_S32 sw_nal_ref_idc = 0;

    {
        MppBuffer buf = mpp_packet_get_buffer(pkt);
        RK_S32 fd = mpp_buffer_get_fd(buf);

        mpp_dmabuf_sync_partial_begin(fd, 1, base, len, __FUNCTION__);
    }

    val = p[4];
    hw_nal_ref_idc = (val >> 5) & 0x3;
    sw_nal_ref_idc = slice->nal_reference_idc;

    if (hw_nal_ref_idc == sw_nal_ref_idc)
        return MPP_OK;

    /* fix nal_ref_idc in all slice */
    if (!slice->is_multi_slice) {
        /* single slice do NOT scan */
        val = val & (~0x60);
        val |= (sw_nal_ref_idc << 5) & 0x60;
        p[4] = val;
        return MPP_OK;
    }

    /* multi-slice fix each nal_ref_idc */
    do {
        RK_U32 nal_len = get_next_nal(p, &len);

        val = p[4];
        val = val & (~0x60);
        val |= (sw_nal_ref_idc << 5) & 0x60;
        p[4] = val;

        if (len == 0)
            break;

        p += nal_len;
    } while (1);

    return MPP_OK;
}